

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O3

bool __thiscall CTransaction::ComputeHasWitness(CTransaction *this)

{
  pointer pCVar1;
  pointer pCVar2;
  pointer pCVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  
  pCVar2 = (this->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (this->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)pCVar1 - (long)pCVar2;
  lVar4 = (lVar5 >> 3) * 0x4ec4ec4ec4ec4ec5 >> 2;
  if (0 < lVar4) {
    lVar5 = lVar4 + 1;
    pCVar3 = pCVar2 + 2;
    do {
      if (pCVar3[-2].scriptWitness.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          pCVar3[-2].scriptWitness.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pCVar3 = pCVar3 + -2;
        goto LAB_0082159f;
      }
      if (pCVar3[-1].scriptWitness.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          pCVar3[-1].scriptWitness.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pCVar3 = pCVar3 + -1;
        goto LAB_0082159f;
      }
      if ((pCVar3->scriptWitness).stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pCVar3->scriptWitness).stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0082159f;
      if (pCVar3[1].scriptWitness.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          pCVar3[1].scriptWitness.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pCVar3 = pCVar3 + 1;
        goto LAB_0082159f;
      }
      lVar5 = lVar5 + -1;
      pCVar3 = pCVar3 + 4;
    } while (1 < lVar5);
    lVar5 = (long)pCVar1 - (long)(pCVar2 + lVar4 * 4);
    pCVar2 = pCVar2 + lVar4 * 4;
  }
  lVar4 = (lVar5 >> 3) * 0x4ec4ec4ec4ec4ec5;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pCVar3 = pCVar1;
      if ((lVar4 != 3) ||
         (pCVar3 = pCVar2,
         (pCVar2->scriptWitness).stack.
         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (pCVar2->scriptWitness).stack.
         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_0082159f;
      pCVar2 = pCVar2 + 1;
    }
    pCVar3 = pCVar2;
    if ((pCVar2->scriptWitness).stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pCVar2->scriptWitness).stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0082159f;
    pCVar2 = pCVar2 + 1;
  }
  pCVar3 = pCVar2;
  if ((pCVar2->scriptWitness).stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pCVar2->scriptWitness).stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pCVar3 = pCVar1;
  }
LAB_0082159f:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return pCVar3 != pCVar1;
}

Assistant:

bool CTransaction::ComputeHasWitness() const
{
    return std::any_of(vin.begin(), vin.end(), [](const auto& input) {
        return !input.scriptWitness.IsNull();
    });
}